

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Array<float,_9> * __thiscall
tcu::Matrix<float,_3,_3>::getColumnMajorData
          (Array<float,_9> *__return_storage_ptr__,Matrix<float,_3,_3> *this)

{
  Array<float,_9> *pAVar1;
  int col;
  long lVar2;
  Array<float,_9> *a;
  long lVar3;
  
  pAVar1 = __return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
      *(undefined4 *)((long)__return_storage_ptr__ + lVar3) =
           *(undefined4 *)
            ((long)((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)this)->m_data)->m_data
                   [0].m_data + lVar3);
    }
    this = (Matrix<float,_3,_3> *)((long)this + 0xc);
    __return_storage_ptr__ = (Array<float,_9> *)((long)__return_storage_ptr__ + 0xc);
  }
  return pAVar1;
}

Assistant:

Array<T, Rows*Cols> Matrix<T, Rows, Cols>::getColumnMajorData (void) const
{
	Array<T, Rows*Cols> a;
	T* dst = a.getPtr();
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			*dst++ = (*this)(row, col);
	return a;
}